

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::AddHorzJoin(Clipper *this,TEdge *e,int idx)

{
  HorzJoinRec *hj;
  
  hj = (HorzJoinRec *)operator_new(0x10);
  hj->edge = e;
  hj->savedIdx = idx;
  std::vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>::push_back
            (&this->m_HorizJoins,&hj);
  return;
}

Assistant:

void Clipper::AddHorzJoin(TEdge *e, int idx)
{
  HorzJoinRec* hj = new HorzJoinRec;
  hj->edge = e;
  hj->savedIdx = idx;
  m_HorizJoins.push_back(hj);
}